

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

void __thiscall ON_Xform::PlanarProjection(ON_Xform *this,ON_Plane *plane)

{
  double dVar1;
  double dStack_98;
  double q [3];
  double local_78;
  double p [3];
  double local_58;
  double y [3];
  double local_38;
  double x [3];
  int j;
  int i;
  ON_Plane *plane_local;
  ON_Xform *this_local;
  
  x[0] = (plane->xaxis).y;
  x[1] = (plane->xaxis).z;
  y[0] = (plane->yaxis).y;
  y[1] = (plane->yaxis).z;
  dVar1 = (plane->origin).x;
  p[0] = (plane->origin).y;
  p[1] = (plane->origin).z;
  for (x[2]._4_4_ = 0; x[2]._4_4_ < 3; x[2]._4_4_ = x[2]._4_4_ + 1) {
    for (x[2]._0_4_ = 0; x[2]._0_4_ < 3; x[2]._0_4_ = x[2]._0_4_ + 1) {
      this->m_xform[x[2]._4_4_][x[2]._0_4_] =
           x[(long)x[2]._4_4_ + -1] * x[(long)x[2]._0_4_ + -1] +
           y[(long)x[2]._4_4_ + -1] * y[(long)x[2]._0_4_ + -1];
    }
    q[(long)x[2]._4_4_ + -1] =
         this->m_xform[x[2]._4_4_][2] * p[1] +
         this->m_xform[x[2]._4_4_][0] * dVar1 + this->m_xform[x[2]._4_4_][1] * p[0];
  }
  for (x[2]._4_4_ = 0; x[2]._4_4_ < 3; x[2]._4_4_ = x[2]._4_4_ + 1) {
    this->m_xform[3][x[2]._4_4_] = 0.0;
    this->m_xform[x[2]._4_4_][3] = p[(long)x[2]._4_4_ + -1] - q[(long)x[2]._4_4_ + -1];
  }
  this->m_xform[3][3] = 1.0;
  return;
}

Assistant:

void ON_Xform::PlanarProjection( const ON_Plane& plane )
{
  int i, j;
  double x[3] = {plane.xaxis.x,plane.xaxis.y,plane.xaxis.z};
  double y[3] = {plane.yaxis.x,plane.yaxis.y,plane.yaxis.z};
  double p[3] = {plane.origin.x,plane.origin.y,plane.origin.z};
  double q[3];
  for ( i = 0; i < 3; i++ ) 
  {
    for ( j = 0; j < 3; j++ )
    {
      m_xform[i][j] = x[i]*x[j] + y[i]*y[j];
    }
    q[i] = m_xform[i][0]*p[0] + m_xform[i][1]*p[1] + m_xform[i][2]*p[2];
  }
  for ( i = 0; i < 3; i++ )
  {
    m_xform[3][i] = 0.0;
    m_xform[i][3] = p[i]-q[i];
  }
  m_xform[3][3] = 1.0;
}